

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mask.c
# Opt level: O0

int mask_intersect(uint32_t *a,uint32_t *b,int size)

{
  int local_30;
  int local_2c;
  int j;
  int i;
  int rsize;
  int size_local;
  uint32_t *b_local;
  uint32_t *a_local;
  
  local_2c = 0;
  do {
    if ((size + 0x1f) / 0x20 <= local_2c) {
      return -1;
    }
    if ((a[local_2c] & b[local_2c]) != 0) {
      for (local_30 = 0; local_30 < 0x20; local_30 = local_30 + 1) {
        if ((a[local_2c] & b[local_2c] & 1 << ((byte)local_30 & 0x1f)) != 0) {
          return local_30;
        }
      }
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

int mask_intersect(uint32_t *a, uint32_t *b, int size) {
	int rsize = MASK_SIZE(size);
	int i;
	for (i = 0; i < rsize; i++)
		if (a[i] & b[i]) {
			int j;
			for (j = 0; j < MASK_CHUNK_SIZE; j++)
				if (a[i] & b[i] & (uint32_t)1 << j)
					return j;
		}
	return -1;
}